

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psac_vs_dss.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  size_type *psVar3;
  bool bVar4;
  char **ppcVar5;
  _Alloc_hider begin;
  int iVar6;
  long lVar7;
  ostream *poVar8;
  long lVar9;
  long lVar10;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end;
  int rank;
  string input_str;
  vector<unsigned_long,_std::allocator<unsigned_long>_> SA;
  int argc_local;
  char **argv_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> glSA;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_838;
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
  sa;
  string local_str;
  ios_base local_588 [264];
  SwitchArg checkArg;
  ValueArg<int> seedArg;
  ValueArg<unsigned_long> randArg;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> fileArg
  ;
  CmdLine cmd;
  
  argc_local = argc;
  argv_local = argv;
  MPI_Init(&argc_local,&argv_local);
  MPI_Comm_rank(&ompi_mpi_comm_world,&rank);
  sa._vptr_suffix_array = (_func_int **)&sa.local_size;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&sa,"Compare our parallel implementation with divsufsort.","");
  paVar1 = &local_str.field_2;
  local_str._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_str,"none","");
  TCLAP::CmdLine::CmdLine(&cmd,(string *)&sa,' ',&local_str,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_str._M_dataplus._M_p != paVar1) {
    operator_delete(local_str._M_dataplus._M_p);
  }
  if (sa._vptr_suffix_array != (_func_int **)&sa.local_size) {
    operator_delete(sa._vptr_suffix_array);
  }
  sa._vptr_suffix_array = (_func_int **)&sa.local_size;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sa,"f","");
  local_str._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_str,"file","");
  psVar2 = &randArg.super_Arg._flag._M_string_length;
  randArg.super_Arg._vptr_Arg = (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&randArg,"Input filename.","");
  local_838._M_dataplus._M_p = (pointer)&local_838.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_838,"");
  psVar3 = &seedArg.super_Arg._flag._M_string_length;
  seedArg.super_Arg._vptr_Arg = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&seedArg,"filename","");
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ValueArg(&fileArg,(string *)&sa,&local_str,(string *)&randArg,true,&local_838,(string *)&seedArg
             ,(Visitor *)0x0);
  if (seedArg.super_Arg._vptr_Arg != (_func_int **)psVar3) {
    operator_delete(seedArg.super_Arg._vptr_Arg);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838._M_dataplus._M_p != &local_838.field_2) {
    operator_delete(local_838._M_dataplus._M_p);
  }
  if (randArg.super_Arg._vptr_Arg != (_func_int **)psVar2) {
    operator_delete(randArg.super_Arg._vptr_Arg);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_str._M_dataplus._M_p != paVar1) {
    operator_delete(local_str._M_dataplus._M_p);
  }
  if (sa._vptr_suffix_array != (_func_int **)&sa.local_size) {
    operator_delete(sa._vptr_suffix_array);
  }
  sa._vptr_suffix_array = (_func_int **)&sa.local_size;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sa,"r","");
  local_str._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_str,"random","");
  seedArg.super_Arg._vptr_Arg = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&seedArg,"Random input size","");
  psVar2 = &checkArg.super_Arg._flag._M_string_length;
  checkArg.super_Arg._vptr_Arg = (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&checkArg,"size","");
  TCLAP::ValueArg<unsigned_long>::ValueArg
            (&randArg,(string *)&sa,&local_str,(string *)&seedArg,true,0,(string *)&checkArg,
             (Visitor *)0x0);
  if (checkArg.super_Arg._vptr_Arg != (_func_int **)psVar2) {
    operator_delete(checkArg.super_Arg._vptr_Arg);
  }
  if (seedArg.super_Arg._vptr_Arg != (_func_int **)psVar3) {
    operator_delete(seedArg.super_Arg._vptr_Arg);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_str._M_dataplus._M_p != paVar1) {
    operator_delete(local_str._M_dataplus._M_p);
  }
  if (sa._vptr_suffix_array != (_func_int **)&sa.local_size) {
    operator_delete(sa._vptr_suffix_array);
  }
  sa._vptr_suffix_array = (_func_int **)&sa.local_size;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sa,"s","");
  local_str._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_str,"seed","");
  checkArg.super_Arg._vptr_Arg = (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&checkArg,"Sets the seed for the ranom input generation","");
  input_str._M_dataplus._M_p = (pointer)&input_str.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&input_str,"int","");
  TCLAP::ValueArg<int>::ValueArg
            (&seedArg,(string *)&sa,&local_str,(string *)&checkArg,false,0,&input_str,(Visitor *)0x0
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)input_str._M_dataplus._M_p != &input_str.field_2) {
    operator_delete(input_str._M_dataplus._M_p);
  }
  if (checkArg.super_Arg._vptr_Arg != (_func_int **)psVar2) {
    operator_delete(checkArg.super_Arg._vptr_Arg);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_str._M_dataplus._M_p != paVar1) {
    operator_delete(local_str._M_dataplus._M_p);
  }
  if (sa._vptr_suffix_array != (_func_int **)&sa.local_size) {
    operator_delete(sa._vptr_suffix_array);
  }
  (*cmd.super_CmdLineInterface._vptr_CmdLineInterface[3])();
  sa._vptr_suffix_array = (_func_int **)0x0;
  sa.n = 0;
  sa.local_size = 0;
  local_str._M_dataplus._M_p = (pointer)&fileArg;
  std::vector<TCLAP::Arg*,std::allocator<TCLAP::Arg*>>::_M_realloc_insert<TCLAP::Arg*>
            ((vector<TCLAP::Arg*,std::allocator<TCLAP::Arg*>> *)&sa,(iterator)0x0,(Arg **)&local_str
            );
  local_str._M_dataplus._M_p = (pointer)&randArg;
  if (sa.n == sa.local_size) {
    std::vector<TCLAP::Arg*,std::allocator<TCLAP::Arg*>>::_M_realloc_insert<TCLAP::Arg*>
              ((vector<TCLAP::Arg*,std::allocator<TCLAP::Arg*>> *)&sa,(iterator)sa.n,
               (Arg **)&local_str);
  }
  else {
    *(ValueArg<unsigned_long> **)sa.n = &randArg;
    sa.n = sa.n + 8;
  }
  (*cmd.super_CmdLineInterface._vptr_CmdLineInterface[5])(&cmd,&sa);
  if (sa._vptr_suffix_array != (_func_int **)0x0) {
    operator_delete(sa._vptr_suffix_array);
  }
  sa._vptr_suffix_array = (_func_int **)&sa.local_size;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sa,"c","");
  local_str._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_str,"check","");
  input_str._M_dataplus._M_p = (pointer)&input_str.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&input_str,"Check correctness of SA for PSAC using divsufsort `sufcheck()`.",
             "");
  TCLAP::Arg::Arg(&checkArg.super_Arg,(string *)&sa,&local_str,&input_str,false,false,(Visitor *)0x0
                 );
  checkArg.super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_0013d3b0;
  checkArg.super_Arg._163_2_ = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)input_str._M_dataplus._M_p != &input_str.field_2) {
    operator_delete(input_str._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_str._M_dataplus._M_p != paVar1) {
    operator_delete(local_str._M_dataplus._M_p);
  }
  if (sa._vptr_suffix_array != (_func_int **)&sa.local_size) {
    operator_delete(sa._vptr_suffix_array);
  }
  (*cmd.super_CmdLineInterface._vptr_CmdLineInterface[3])(&cmd,&checkArg);
  ppcVar5 = argv_local;
  lVar9 = (long)argc_local;
  local_str._M_dataplus._M_p = (pointer)0x0;
  local_str._M_string_length = 0;
  local_str.field_2._M_allocated_capacity = 0;
  if (0 < lVar9) {
    lVar10 = 0;
    do {
      std::__cxx11::string::string((string *)&sa,ppcVar5[lVar10],(allocator *)&input_str);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_str,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sa);
      if (sa._vptr_suffix_array != (_func_int **)&sa.local_size) {
        operator_delete(sa._vptr_suffix_array);
      }
      lVar10 = lVar10 + 1;
    } while (lVar9 != lVar10);
  }
  TCLAP::CmdLine::parse
            (&cmd,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_str);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_str);
  input_str._M_dataplus._M_p = (pointer)&input_str.field_2;
  input_str._M_string_length = 0;
  input_str.field_2._M_local_buf[0] = '\0';
  if (rank == 0) {
    iVar6 = std::__cxx11::string::compare((char *)&fileArg._value);
    if (iVar6 == 0) {
      rand_dna_abi_cxx11_((string *)&sa,randArg._value,seedArg.super_Arg._164_4_);
      std::__cxx11::string::operator=((string *)&input_str,(string *)&sa);
      if (sa._vptr_suffix_array != (_func_int **)&sa.local_size) {
        operator_delete(sa._vptr_suffix_array);
      }
    }
    else {
      std::ifstream::ifstream(&sa,fileArg._value._M_dataplus._M_p,_S_in);
      std::__cxx11::stringstream::stringstream((stringstream *)&local_str);
      std::ostream::operator<<(&local_str.field_2,(streambuf *)&sa.local_size);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&input_str,(string *)&SA);
      if ((pointer *)
          SA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start !=
          &SA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage) {
        operator_delete(SA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                        .super__Vector_impl_data._M_start);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&local_str);
      std::ios_base::~ios_base(local_588);
      std::ifstream::~ifstream(&sa);
    }
  }
  sa._vptr_suffix_array = (_func_int **)&PTR__comm_0013d640;
  sa.n = (size_t)&ompi_mpi_comm_world;
  sa.comm._vptr_comm._0_1_ = 0;
  MPI_Comm_size();
  MPI_Comm_rank(sa.n);
  mxx::impl::
  distribute_container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::stable_distribute(&local_str,&input_str,(comm *)&sa);
  mxx::comm::~comm((comm *)&sa);
  lVar9 = std::chrono::_V2::steady_clock::now();
  lVar10 = std::chrono::_V2::steady_clock::now();
  begin = local_str._M_dataplus;
  end._M_current = local_str._M_dataplus._M_p + local_str._M_string_length;
  SA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__comm_0013d640;
  SA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&ompi_mpi_comm_world;
  MPI_Comm_size();
  MPI_Comm_rank(SA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish);
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
  ::suffix_array(&sa,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )begin._M_p,end,(comm *)&SA);
  mxx::comm::~comm((comm *)&SA);
  suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>::
  construct_arr<2ul>((suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>
                      *)&sa,true);
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (rank == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"PSAC time: ",0xb);
    poVar8 = std::ostream::_M_insert<double>
                       ((double)(lVar7 - lVar9) / 1000000.0 - (double)(lVar10 - lVar9) / 1000000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," ms",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  SA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__comm_0013d640;
  SA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&ompi_mpi_comm_world;
  MPI_Comm_size();
  MPI_Comm_rank(SA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish);
  mxx::gatherv<unsigned_long>
            (&glSA,sa.local_SA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start,
             (long)sa.local_SA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)sa.local_SA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3,0,(comm *)&SA);
  mxx::comm::~comm((comm *)&SA);
  bVar4 = true;
  if (rank != 0) goto LAB_001174e5;
  lVar9 = std::chrono::_V2::steady_clock::now();
  SA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  SA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  SA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar10 = std::chrono::_V2::steady_clock::now();
  dss::construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long>
            ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )input_str._M_dataplus._M_p,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(input_str._M_dataplus._M_p + input_str._M_string_length),&SA);
  lVar7 = std::chrono::_V2::steady_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"divsufsort time: ",0x11)
  ;
  poVar8 = std::ostream::_M_insert<double>
                     ((double)(lVar7 - lVar9) / 1000000.0 - (double)(lVar10 - lVar9) / 1000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ms",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  if (checkArg.super_Arg._163_1_ == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Checking for correctness...",0x1b);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    if ((long)glSA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)glSA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 == input_str._M_string_length) {
      iVar6 = sufcheck64(input_str._M_dataplus._M_p,
                         glSA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start,input_str._M_string_length,1);
      if (iVar6 == 0) {
        if ((long)SA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)SA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3 == input_str._M_string_length) {
          iVar6 = sufcheck64(input_str._M_dataplus._M_p,
                             SA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start,input_str._M_string_length,1);
          if (iVar6 == 0) goto LAB_00117980;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"ERROR: wrong suffix array from divsufsort",0x29);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x58);
        std::ostream::put(-0x58);
        std::ostream::flush();
        goto LAB_00117980;
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ERROR: wrong suffix array from PSAC",0x23);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    if (SA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(SA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    bVar4 = false;
  }
  else {
LAB_00117980:
    if (SA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(SA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
LAB_001174e5:
  if (glSA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(glSA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
  ::~suffix_array(&sa);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_str._M_dataplus._M_p != &local_str.field_2) {
    operator_delete(local_str._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)input_str._M_dataplus._M_p != &input_str.field_2) {
    operator_delete(input_str._M_dataplus._M_p);
  }
  checkArg.super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_0013d258;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)checkArg.super_Arg._requireLabel._M_dataplus._M_p !=
      &checkArg.super_Arg._requireLabel.field_2) {
    operator_delete(checkArg.super_Arg._requireLabel._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)checkArg.super_Arg._description._M_dataplus._M_p !=
      &checkArg.super_Arg._description.field_2) {
    operator_delete(checkArg.super_Arg._description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)checkArg.super_Arg._name._M_dataplus._M_p != &checkArg.super_Arg._name.field_2) {
    operator_delete(checkArg.super_Arg._name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)checkArg.super_Arg._flag._M_dataplus._M_p != &checkArg.super_Arg._flag.field_2) {
    operator_delete(checkArg.super_Arg._flag._M_dataplus._M_p);
  }
  seedArg.super_Arg._vptr_Arg = (_func_int **)&PTR__ValueArg_0013d670;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)seedArg._typeDesc._M_dataplus._M_p != &seedArg._typeDesc.field_2) {
    operator_delete(seedArg._typeDesc._M_dataplus._M_p);
  }
  seedArg.super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_0013d258;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)seedArg.super_Arg._requireLabel._M_dataplus._M_p !=
      &seedArg.super_Arg._requireLabel.field_2) {
    operator_delete(seedArg.super_Arg._requireLabel._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)seedArg.super_Arg._description._M_dataplus._M_p != &seedArg.super_Arg._description.field_2)
  {
    operator_delete(seedArg.super_Arg._description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)seedArg.super_Arg._name._M_dataplus._M_p != &seedArg.super_Arg._name.field_2) {
    operator_delete(seedArg.super_Arg._name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)seedArg.super_Arg._flag._M_dataplus._M_p != &seedArg.super_Arg._flag.field_2) {
    operator_delete(seedArg.super_Arg._flag._M_dataplus._M_p);
  }
  randArg.super_Arg._vptr_Arg = (_func_int **)&PTR__ValueArg_0013d778;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)randArg._typeDesc._M_dataplus._M_p != &randArg._typeDesc.field_2) {
    operator_delete(randArg._typeDesc._M_dataplus._M_p);
  }
  randArg.super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_0013d258;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)randArg.super_Arg._requireLabel._M_dataplus._M_p !=
      &randArg.super_Arg._requireLabel.field_2) {
    operator_delete(randArg.super_Arg._requireLabel._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)randArg.super_Arg._description._M_dataplus._M_p != &randArg.super_Arg._description.field_2)
  {
    operator_delete(randArg.super_Arg._description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)randArg.super_Arg._name._M_dataplus._M_p != &randArg.super_Arg._name.field_2) {
    operator_delete(randArg.super_Arg._name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)randArg.super_Arg._flag._M_dataplus._M_p != &randArg.super_Arg._flag.field_2) {
    operator_delete(randArg.super_Arg._flag._M_dataplus._M_p);
  }
  fileArg.super_Arg._vptr_Arg = (_func_int **)&PTR__ValueArg_0013d810;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fileArg._typeDesc._M_dataplus._M_p != &fileArg._typeDesc.field_2) {
    operator_delete(fileArg._typeDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fileArg._default._M_dataplus._M_p != &fileArg._default.field_2) {
    operator_delete(fileArg._default._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fileArg._value._M_dataplus._M_p != &fileArg._value.field_2) {
    operator_delete(fileArg._value._M_dataplus._M_p);
  }
  fileArg.super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_0013d258;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fileArg.super_Arg._requireLabel._M_dataplus._M_p !=
      &fileArg.super_Arg._requireLabel.field_2) {
    operator_delete(fileArg.super_Arg._requireLabel._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fileArg.super_Arg._description._M_dataplus._M_p != &fileArg.super_Arg._description.field_2)
  {
    operator_delete(fileArg.super_Arg._description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fileArg.super_Arg._name._M_dataplus._M_p != &fileArg.super_Arg._name.field_2) {
    operator_delete(fileArg.super_Arg._name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fileArg.super_Arg._flag._M_dataplus._M_p != &fileArg.super_Arg._flag.field_2) {
    operator_delete(fileArg.super_Arg._flag._M_dataplus._M_p);
  }
  TCLAP::CmdLine::~CmdLine(&cmd);
  if (bVar4) {
    MPI_Finalize();
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    // set up MPI
    MPI_Init(&argc, &argv);
    int rank;
    MPI_Comm_rank(MPI_COMM_WORLD, &rank);

    try {
    // define commandline usage
    TCLAP::CmdLine cmd("Compare our parallel implementation with divsufsort.");
    TCLAP::ValueArg<std::string> fileArg("f", "file", "Input filename.", true, "", "filename");
    TCLAP::ValueArg<std::size_t> randArg("r", "random", "Random input size", true, 0, "size");
    TCLAP::ValueArg<int> seedArg("s", "seed", "Sets the seed for the ranom input generation", false, 0, "int");
    cmd.add(seedArg);
    cmd.xorAdd(fileArg, randArg);
    TCLAP::SwitchArg  checkArg("c", "check", "Check correctness of SA for PSAC using divsufsort `sufcheck()`.", false);
    cmd.add(checkArg);
    cmd.parse(argc, argv);

    // read input file or generate input on master processor
    std::string input_str;
    if (rank == 0) {
        if (fileArg.getValue() != "") {
            std::ifstream t(fileArg.getValue().c_str());
            std::stringstream buffer;
            buffer << t.rdbuf();
            input_str = buffer.str();
        } else {
            input_str = rand_dna(randArg.getValue(), seedArg.getValue());
        }
    }

    // TODO differentiate between index types

    // run our distributed suffix array construction
    std::string local_str = mxx::stable_distribute(input_str, MPI_COMM_WORLD);
    mxx::timer t;
    double start = t.elapsed();
    suffix_array<std::string::iterator, index_t, false> sa(local_str.begin(), local_str.end(), MPI_COMM_WORLD);
    // TODO: choose construction method!
    sa.construct_arr<2>(true);
    //sa.construct_arr<2>();
    double end = t.elapsed() - start;
    if (rank == 0)
        std::cerr << "PSAC time: " << end << " ms" << std::endl;
    std::vector<index_t> glSA = mxx::gatherv(sa.local_SA, 0);


    // run construction with divsufsort locally on rank 0
    if (rank == 0) {
        mxx::timer t;
        std::vector<index_t> SA;
        double start = t.elapsed();
        dss::construct(input_str.begin(), input_str.end(), SA);
        double end = t.elapsed() - start;
        std::cerr << "divsufsort time: " << end << " ms" << std::endl;

        // check correctness if we should do so!
        if (checkArg.getValue()) {
            std::cerr << "Checking for correctness..." << std::endl;
            if(!dss::check(input_str.begin(), input_str.end(), glSA)) {
                std::cerr << "ERROR: wrong suffix array from PSAC" << std::endl;
                return false;
            }
            if(!dss::check(input_str.begin(), input_str.end(), SA)) {
                std::cerr << "ERROR: wrong suffix array from divsufsort" << std::endl;
            }
        }
    }

    // catch any TCLAP exception
    } catch (TCLAP::ArgException& e) {
        std::cerr << "error: " << e.error() << " for arg " << e.argId() << std::endl;
        exit(EXIT_FAILURE);
    }

    // finalize MPI
    MPI_Finalize();

    return 0;
}